

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappeablebloomfilter.h
# Opt level: O0

bool __thiscall MappeableBloomFilter<12>::Contain(MappeableBloomFilter<12> *this,uint64_t key)

{
  ulong uVar1;
  uint64_t uVar2;
  size_t sVar3;
  uint64_t uVar4;
  long in_RDI;
  int i;
  uint64_t b;
  uint64_t a;
  uint64_t hash;
  size_t in_stack_ffffffffffffffa8;
  MixSplit *in_stack_ffffffffffffffb0;
  int local_34;
  ulong local_28;
  
  uVar2 = MixSplit::operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_28 = uVar2 >> 0x20;
  local_34 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x18) <= local_34) {
      return true;
    }
    uVar4 = *(uint64_t *)(in_RDI + 8);
    sVar3 = fastrangesize(uVar4,in_stack_ffffffffffffffa8);
    uVar1 = *(ulong *)(uVar4 + sVar3 * 8);
    uVar4 = getBit((uint32_t)local_28);
    if ((uVar1 & uVar4) == 0) break;
    local_28 = uVar2 + local_28;
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

bool Contain(const uint64_t key) const {
    uint64_t hash = hasher(key);
    uint64_t a = (hash >> 32) | (hash << 32);;
    uint64_t b = hash;
    for (int i = 0; i < k; i++) {
      if ((data[fastrangesize(a, this->arrayLength)] & getBit(a)) == 0) {
        return false;
      }
      a += b;
    }
    return true;
  }